

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

string * __thiscall
slang::CommandLine::addRenameCommand_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view value)

{
  long lVar1;
  void *pvVar2;
  size_t sVar3;
  mapped_type *pmVar5;
  char *__s;
  size_t __n_00;
  ulong uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  size_type __n;
  string_view fmt;
  format_args args;
  key_type local_58;
  size_t sVar4;
  
  __s = value._M_str;
  __n_00 = value._M_len;
  if (__n_00 != 0) {
    pvVar2 = memchr(__s,0x2c,__n_00);
    uVar6 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
    sVar4 = __n_00;
    do {
      sVar3 = sVar4 - 1;
      if (sVar4 == 0) {
        sVar3 = 0xffffffffffffffff;
        break;
      }
      lVar1 = sVar4 - 1;
      sVar4 = sVar3;
    } while (__s[lVar1] != ',');
    if (uVar6 != 0xffffffffffffffff && uVar6 == sVar3) {
      if (uVar6 < __n_00) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + uVar6);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->cmdRename,&local_58);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,(ulong)(__s + uVar6 + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar6 + 1,__n_00);
    }
  }
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x27;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_58;
  local_58._M_dataplus._M_p = __s;
  local_58._M_string_length = __n_00;
  ::fmt::v9::vformat_abi_cxx11_
            (__return_storage_ptr__,(v9 *)"missing or extra comma in argument \'{}\'",fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::addRenameCommand(string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const string_view slangName = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);
    cmdRename[std::string(value)] = slangName;
    return {};
}